

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceGLImpl::CreateBLAS
          (RenderDeviceGLImpl *this,BottomLevelASDesc *Desc,IBottomLevelAS **ppBLAS)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  IBottomLevelAS **ppBLAS_local;
  BottomLevelASDesc *Desc_local;
  RenderDeviceGLImpl *this_local;
  
  msg.field_2._8_8_ = ppBLAS;
  FormatString<char[38]>((string *)local_40,(char (*) [38])"CreateBLAS is not supported in OpenGL");
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"CreateBLAS",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
             ,0x26e);
  std::__cxx11::string::~string((string *)local_40);
  *(undefined8 *)msg.field_2._8_8_ = 0;
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateBLAS(const BottomLevelASDesc& Desc,
                                    IBottomLevelAS**         ppBLAS)
{
    UNSUPPORTED("CreateBLAS is not supported in OpenGL");
    *ppBLAS = nullptr;
}